

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O1

void __thiscall senjo::GoCommandHandle::Execute(GoCommandHandle *this)

{
  ChessEngine *this_00;
  Output OStack_58;
  string ponder;
  string bestmove;
  
  this_00 = (this->super_BackgroundCommand).engine;
  if (this_00 == (ChessEngine *)0x0) {
    Output::Output((Output *)&ponder,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Engine not set for \'go\' command",0x1f);
    Output::~Output((Output *)&ponder);
  }
  else {
    __stop = 0;
    ponder._M_string_length = 0;
    ponder.field_2._M_local_buf[0] = '\0';
    ponder._M_dataplus._M_p = (pointer)&ponder.field_2;
    ChessEngine::Go(&bestmove,this_00,this->depth,this->movestogo,this->movetime,this->wtime,
                    this->winc,this->btime,this->binc,&ponder);
    if (bestmove._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&bestmove,0,(char *)0x0,0x148f7d);
      ponder._M_string_length = 0;
      *ponder._M_dataplus._M_p = '\0';
    }
    if (ponder._M_string_length == 0) {
      Output::Output(&OStack_58,NoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bestmove ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,bestmove._M_dataplus._M_p,bestmove._M_string_length);
    }
    else {
      Output::Output(&OStack_58,NoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bestmove ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,bestmove._M_dataplus._M_p,bestmove._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ponder ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,ponder._M_dataplus._M_p,ponder._M_string_length);
    }
    Output::~Output(&OStack_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bestmove._M_dataplus._M_p != &bestmove.field_2) {
      operator_delete(bestmove._M_dataplus._M_p,bestmove.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ponder._M_dataplus._M_p != &ponder.field_2) {
      operator_delete(ponder._M_dataplus._M_p,
                      CONCAT71(ponder.field_2._M_allocated_capacity._1_7_,
                               ponder.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void GoCommandHandle::Execute()
{
  if (!engine) {
    Output() << "Engine not set for 'go' command";
    return;
  }

  engine->ClearStopFlags();

  std::string ponder; // NOTE: shadows this->ponder
  std::string bestmove =
      engine->Go(depth, movestogo, movetime, wtime, winc, btime, binc, &ponder);

  if (bestmove.empty()) {
    bestmove = "none";
    ponder.clear();
  }

  if (ponder.size()) {
    Output(Output::NoPrefix) << "bestmove " << bestmove << " ponder " << ponder;
  }
  else {
    Output(Output::NoPrefix) << "bestmove " << bestmove;
  }
}